

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scpserver.c
# Opt level: O2

void scp_source_free(ScpServer *s)

{
  ScpServerVtable *ptr;
  uint uVar1;
  
  scp_reply_cleanup((ScpReplyReceiver *)(s + -0x10));
  while (0 < *(int *)&s[-0x13].vt) {
    uVar1 = *(int *)&s[-0x13].vt - 1;
    *(uint *)&s[-0x13].vt = uVar1;
    strbuf_free((strbuf *)s[(ulong)uVar1 - 0x16].vt);
  }
  while (ptr = s[-0x18].vt, ptr != (ScpServerVtable *)0x0) {
    s[-0x18].vt = (ScpServerVtable *)ptr->free;
    safefree(ptr);
  }
  delete_callbacks_for_context(s + -0x1b);
  safefree(s + -0x1b);
  return;
}

Assistant:

static void scp_source_free(ScpServer *s)
{
    ScpSource *scp = container_of(s, ScpSource, scpserver);
    scp_reply_cleanup(&scp->reply);
    while (scp->n_pending_commands > 0)
        strbuf_free(scp->pending_commands[--scp->n_pending_commands]);
    while (scp->head) {
        ScpSourceStackEntry *node = scp->head;
        scp->head = node->next;
        sfree(node);
    }

    delete_callbacks_for_context(scp);

    sfree(scp);
}